

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint32_t non_shared;
  uint32_t value_length;
  uint32_t shared;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  pcVar1 = this->data_;
  uVar2 = ((int)(this->value_).data_ + (int)(this->value_).size_) - (int)pcVar1;
  this->current_ = uVar2;
  uVar3 = this->restarts_;
  if ((ulong)uVar2 < (ulong)uVar3) {
    pcVar1 = DecodeEntry(pcVar1 + uVar2,pcVar1 + uVar3,&local_1c,&local_24,&local_20);
    if ((pcVar1 != (char *)0x0) && ((ulong)local_1c <= (this->key_)._M_string_length)) {
      std::__cxx11::string::resize((ulong)&this->key_);
      std::__cxx11::string::append((char *)&this->key_,(ulong)pcVar1);
      (this->value_).data_ = pcVar1 + local_24;
      (this->value_).size_ = (ulong)local_20;
      uVar3 = this->restart_index_;
      while( true ) {
        uVar3 = uVar3 + 1;
        if (this->num_restarts_ <= uVar3) {
          return true;
        }
        if (this->current_ <= *(uint *)(this->data_ + (ulong)uVar3 * 4 + (ulong)this->restarts_))
        break;
        this->restart_index_ = uVar3;
      }
      return true;
    }
    CorruptionError(this);
  }
  else {
    this->current_ = uVar3;
    this->restart_index_ = this->num_restarts_;
  }
  return false;
}

Assistant:

bool ParseNextKey() {
    current_ = (uint32_t)NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }